

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

TrimPositions QStringAlgorithms<const_QByteArray>::trimmed_helper_positions(QByteArray *str)

{
  TrimPositions TVar1;
  Char *end;
  Char *begin;
  bool local_2a;
  bool local_29;
  const_iterator local_28;
  const_iterator local_20;
  
  local_20 = QByteArray::cbegin((QByteArray *)0x4c0d97);
  local_28 = QByteArray::cend((QByteArray *)0x4c0da6);
  while( true ) {
    local_29 = false;
    if (local_20 < local_28) {
      local_29 = isSpace('\0');
    }
    if (local_29 == false) break;
    local_28 = local_28 + -1;
  }
  while( true ) {
    local_2a = false;
    if (local_20 < local_28) {
      local_2a = isSpace('\0');
    }
    if (local_2a == false) break;
    local_20 = local_20 + 1;
  }
  TVar1.end = local_28;
  TVar1.begin = local_20;
  return TVar1;
}

Assistant:

[[nodiscard]] static TrimPositions trimmed_helper_positions(const StringType &str)
    {
        const Char *begin = str.cbegin();
        const Char *end = str.cend();
        // skip white space from end
        while (begin < end && isSpace(end[-1]))
            --end;
        // skip white space from start
        while (begin < end && isSpace(*begin))
            begin++;
        return {begin, end};
    }